

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

int cmSystemTools::WaitForLine
              (cmsysProcess *process,string *line,double timeout,
              vector<char,_std::allocator<char>_> *out,vector<char,_std::allocator<char>_> *err)

{
  char cVar1;
  pointer pcVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  difference_type __offset_1;
  char *pcVar9;
  pointer pcVar10;
  difference_type __offset;
  char *pcVar11;
  char *pcVar12;
  long lVar13;
  char *data;
  int length;
  char *local_58;
  int local_4c;
  string *local_48;
  cmsysProcess *local_40;
  double local_38;
  
  local_48 = line;
  local_40 = process;
  local_38 = timeout;
  iVar5 = std::__cxx11::string::_M_replace((ulong)line,0,(char *)line->_M_string_length,0x4fcadd);
  pcVar7 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pcVar8 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  do {
    pcVar9 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    pcVar11 = pcVar8;
    if (pcVar8 != pcVar9) {
      lVar13 = 0;
      do {
        pcVar12 = pcVar8 + lVar13 + 1;
        cVar1 = pcVar8[lVar13];
        if (cVar1 == '\r') {
          if (pcVar12 == pcVar9) {
            pcVar11 = pcVar8 + lVar13;
            break;
          }
        }
        else if ((cVar1 == '\0') || (cVar1 == '\n')) {
          pcVar10 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pcVar7 = pcVar8 + (lVar13 - (long)pcVar10);
          if ((char *)0x1 < pcVar7) {
            pcVar7 = pcVar8 + (lVar13 - (long)(pcVar10 + (pcVar8[lVar13 + -1] == '\r')));
          }
          if (pcVar7 != (char *)0x0) {
            std::__cxx11::string::append((char *)local_48,(ulong)pcVar10);
          }
          pcVar7 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if (pcVar12 == pcVar7) {
            return 2;
          }
          pcVar9 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          if (pcVar12 != pcVar9) {
            memmove(pcVar7,pcVar12,(size_t)(pcVar9 + (~(ulong)pcVar8 - lVar13)));
          }
          pcVar9 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          if (pcVar7 + (long)pcVar9 + (~(ulong)pcVar8 - lVar13) == pcVar9) {
            return 2;
          }
          (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
          _M_finish = pcVar7 + (long)pcVar9 + (~(ulong)pcVar8 - lVar13);
          return 2;
        }
        lVar13 = lVar13 + 1;
        pcVar11 = pcVar9;
      } while (pcVar12 != pcVar9);
    }
    pcVar8 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    pcVar9 = pcVar7;
    if (pcVar7 != pcVar8) {
      lVar13 = 0;
      do {
        pcVar12 = pcVar7 + lVar13 + 1;
        cVar1 = pcVar7[lVar13];
        if (cVar1 == '\r') {
          if (pcVar12 == pcVar8) {
            pcVar9 = pcVar7 + lVar13;
            break;
          }
        }
        else if ((cVar1 == '\0') || (cVar1 == '\n')) {
          pcVar10 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pcVar8 = pcVar7 + (lVar13 - (long)pcVar10);
          if ((char *)0x1 < pcVar8) {
            pcVar8 = pcVar7 + (lVar13 - (long)(pcVar10 + (pcVar7[lVar13 + -1] == '\r')));
          }
          if (pcVar8 != (char *)0x0) {
            std::__cxx11::string::append((char *)local_48,(ulong)pcVar10);
          }
          pcVar8 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if (pcVar12 == pcVar8) {
            return 3;
          }
          pcVar9 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          if (pcVar12 != pcVar9) {
            memmove(pcVar8,pcVar12,(size_t)(pcVar9 + (~(ulong)pcVar7 - lVar13)));
          }
          pcVar9 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          if (pcVar8 + (long)pcVar9 + (~(ulong)pcVar7 - lVar13) == pcVar9) {
            return 3;
          }
          (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
          _M_finish = pcVar8 + (long)pcVar9 + (~(ulong)pcVar7 - lVar13);
          return 3;
        }
        lVar13 = lVar13 + 1;
        pcVar9 = pcVar8;
      } while (pcVar12 != pcVar8);
    }
    iVar6 = cmsysProcess_WaitForData(local_40,&local_58,&local_4c,&local_38);
    if (iVar6 < 3) {
      if (iVar6 != 0) {
        if (iVar6 == 2) {
          pcVar10 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
          pcVar2 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          std::vector<char,std::allocator<char>>::_M_range_insert<char*>
                    ((vector<char,std::allocator<char>> *)out,pcVar10,local_58,local_58 + local_4c);
          pcVar11 = pcVar10 + ((long)(out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                     super__Vector_impl_data._M_start - (long)pcVar2);
        }
        goto LAB_0023702d;
      }
      pcVar10 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (pcVar10 ==
          (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
          _M_finish) {
        pcVar10 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (pcVar10 !=
            (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
            _M_finish) {
          std::__cxx11::string::append((char *)local_48,(ulong)pcVar10);
          pcVar10 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pcVar2 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          iVar5 = 3;
          iVar6 = iVar5;
          if (pcVar10 == pcVar2) goto LAB_00236fb8;
          pcVar3 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          pcVar10 = pcVar10 + ((long)pcVar3 - (long)pcVar2);
          if (pcVar3 != pcVar10) {
            (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
            _M_finish = pcVar10;
          }
          goto LAB_00237097;
        }
        bVar4 = false;
        iVar5 = 0;
      }
      else {
        std::__cxx11::string::append((char *)local_48,(ulong)pcVar10);
        pcVar10 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pcVar2 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        iVar5 = 2;
        iVar6 = iVar5;
        if (pcVar10 == pcVar2) {
LAB_00236fb8:
          iVar5 = iVar6;
          bVar4 = false;
        }
        else {
          pcVar3 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          pcVar10 = pcVar10 + ((long)pcVar3 - (long)pcVar2);
          if (pcVar3 != pcVar10) {
            (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
            _M_finish = pcVar10;
          }
LAB_00237097:
          bVar4 = false;
        }
      }
    }
    else {
      if (iVar6 == 3) {
        pcVar10 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        pcVar2 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        std::vector<char,std::allocator<char>>::_M_range_insert<char*>
                  ((vector<char,std::allocator<char>> *)err,pcVar10,local_58,local_58 + local_4c);
        pcVar9 = pcVar10 + ((long)(err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                  super__Vector_impl_data._M_start - (long)pcVar2);
      }
      else if (iVar6 == 0xff) goto LAB_00236fb8;
LAB_0023702d:
      bVar4 = true;
    }
    pcVar7 = pcVar9;
    pcVar8 = pcVar11;
    if (!bVar4) {
      return iVar5;
    }
  } while( true );
}

Assistant:

int cmSystemTools::WaitForLine(cmsysProcess* process, std::string& line,
                               double timeout,
                               std::vector<char>& out,
                               std::vector<char>& err)
{
  line = "";
  std::vector<char>::iterator outiter = out.begin();
  std::vector<char>::iterator erriter = err.begin();
  while(1)
    {
    // Check for a newline in stdout.
    for(;outiter != out.end(); ++outiter)
      {
      if((*outiter == '\r') && ((outiter+1) == out.end()))
        {
        break;
        }
      else if(*outiter == '\n' || *outiter == '\0')
        {
        std::vector<char>::size_type length = outiter-out.begin();
        if(length > 1 && *(outiter-1) == '\r')
          {
          --length;
          }
        if(length > 0)
          {
          line.append(&out[0], length);
          }
        out.erase(out.begin(), outiter+1);
        return cmsysProcess_Pipe_STDOUT;
        }
      }

    // Check for a newline in stderr.
    for(;erriter != err.end(); ++erriter)
      {
      if((*erriter == '\r') && ((erriter+1) == err.end()))
        {
        break;
        }
      else if(*erriter == '\n' || *erriter == '\0')
        {
        std::vector<char>::size_type length = erriter-err.begin();
        if(length > 1 && *(erriter-1) == '\r')
          {
          --length;
          }
        if(length > 0)
          {
          line.append(&err[0], length);
          }
        err.erase(err.begin(), erriter+1);
        return cmsysProcess_Pipe_STDERR;
        }
      }

    // No newlines found.  Wait for more data from the process.
    int length;
    char* data;
    int pipe = cmsysProcess_WaitForData(process, &data, &length, &timeout);
    if(pipe == cmsysProcess_Pipe_Timeout)
      {
      // Timeout has been exceeded.
      return pipe;
      }
    else if(pipe == cmsysProcess_Pipe_STDOUT)
      {
      // Append to the stdout buffer.
      std::vector<char>::size_type size = out.size();
      out.insert(out.end(), data, data+length);
      outiter = out.begin()+size;
      }
    else if(pipe == cmsysProcess_Pipe_STDERR)
      {
      // Append to the stderr buffer.
      std::vector<char>::size_type size = err.size();
      err.insert(err.end(), data, data+length);
      erriter = err.begin()+size;
      }
    else if(pipe == cmsysProcess_Pipe_None)
      {
      // Both stdout and stderr pipes have broken.  Return leftover data.
      if(!out.empty())
        {
        line.append(&out[0], outiter-out.begin());
        out.erase(out.begin(), out.end());
        return cmsysProcess_Pipe_STDOUT;
        }
      else if(!err.empty())
        {
        line.append(&err[0], erriter-err.begin());
        err.erase(err.begin(), err.end());
        return cmsysProcess_Pipe_STDERR;
        }
      else
        {
        return cmsysProcess_Pipe_None;
        }
      }
    }
}